

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool medit_damtype(CHAR_DATA *ch,char *argument)

{
  long lVar1;
  int iVar2;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  int value;
  MOB_INDEX_DATA *pMob;
  char *in_stack_000011e0;
  flag_type *in_stack_000011e8;
  bool local_1;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x80) + 0x6c60);
  if (*(char *)&in_RSI->next == '\0') {
    send_to_char(in_RDI,in_RSI);
    send_to_char(in_RDI,in_RSI);
    local_1 = false;
  }
  else {
    iVar2 = flag_value(in_stack_000011e8,in_stack_000011e0);
    if (iVar2 == -99) {
      send_to_char(in_RDI,in_RSI);
      local_1 = false;
    }
    else {
      *(short *)(lVar1 + 0xb8) = (short)iVar2;
      send_to_char(in_RDI,in_RSI);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool medit_damtype(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int value = NO_FLAG;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  damtype [damage message]\n\r", ch);
		send_to_char("Para ver una lista de tipos de mensajes, pon '? weapon'.\n\r", ch);
		return false;
	}

	value = flag_value(weapon_flags, argument);

	if (value != NO_FLAG)
	{
		pMob->dam_type = value;
		send_to_char("Damage type set.\n\r", ch);
		return true;
	}

	send_to_char("MEdit: No such damage type.\n\r", ch);
	return false;
}